

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

exr_result_t unpack_half_to_float_3chan_interleave_rev(exr_decode_pipeline_t *decode)

{
  uint uVar1;
  int iVar2;
  exr_coding_channel_info_t *peVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int y;
  int iVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint8_t *puVar12;
  short *psVar13;
  short *psVar14;
  uint uVar15;
  
  iVar5 = (decode->chunk).height - decode->user_line_end_ignore;
  iVar7 = decode->user_line_begin_skip;
  if (iVar7 < iVar5) {
    peVar3 = decode->channels;
    uVar1 = peVar3->width;
    lVar11 = (long)(int)uVar1;
    psVar13 = (short *)((long)(int)(uVar1 * iVar7 * 6) + (long)decode->unpacked_buffer);
    puVar12 = peVar3[2].field_12.decode_to_ptr;
    iVar2 = peVar3->user_line_stride;
    do {
      if (0 < (int)uVar1) {
        lVar8 = 0;
        psVar14 = psVar13;
        do {
          uVar9 = (uint)psVar14[lVar11 * 2];
          uVar15 = (uVar9 & 0x7fff) << 0xd;
          uVar10 = uVar9 & 0x80000000;
          if (uVar15 < 0x800000) {
            if ((uVar9 & 0x7fff) != 0) {
              uVar4 = 0x1f;
              if ((uVar9 & 0x7fff) != 0) {
                for (; uVar15 >> uVar4 == 0; uVar4 = uVar4 - 1) {
                }
              }
              iVar6 = (uVar4 ^ 0x1f) - 8;
              uVar10 = (uVar10 | uVar15 << ((byte)iVar6 & 0x1f) | 0x38800000) + iVar6 * -0x800000;
            }
          }
          else if (uVar15 < 0xf800000) {
            uVar10 = (uVar10 | uVar15) + 0x38000000;
          }
          else {
            uVar10 = uVar10 | uVar15 | 0x7f800000;
          }
          *(uint *)(puVar12 + lVar8) = uVar10;
          uVar9 = (uint)psVar14[lVar11];
          uVar15 = (uVar9 & 0x7fff) << 0xd;
          uVar10 = uVar9 & 0x80000000;
          if (uVar15 < 0x800000) {
            if ((uVar9 & 0x7fff) != 0) {
              uVar4 = 0x1f;
              if ((uVar9 & 0x7fff) != 0) {
                for (; uVar15 >> uVar4 == 0; uVar4 = uVar4 - 1) {
                }
              }
              iVar6 = (uVar4 ^ 0x1f) - 8;
              uVar10 = (uVar10 | uVar15 << ((byte)iVar6 & 0x1f) | 0x38800000) + iVar6 * -0x800000;
            }
          }
          else if (uVar15 < 0xf800000) {
            uVar10 = (uVar10 | uVar15) + 0x38000000;
          }
          else {
            uVar10 = uVar10 | uVar15 | 0x7f800000;
          }
          *(uint *)(puVar12 + lVar8 + 4) = uVar10;
          uVar9 = (uint)*psVar14;
          uVar15 = (uVar9 & 0x7fff) << 0xd;
          uVar10 = uVar9 & 0x80000000;
          if (uVar15 < 0x800000) {
            if ((uVar9 & 0x7fff) != 0) {
              uVar4 = 0x1f;
              if ((uVar9 & 0x7fff) != 0) {
                for (; uVar15 >> uVar4 == 0; uVar4 = uVar4 - 1) {
                }
              }
              iVar6 = (uVar4 ^ 0x1f) - 8;
              uVar10 = (uVar10 | uVar15 << ((byte)iVar6 & 0x1f) | 0x38800000) + iVar6 * -0x800000;
            }
          }
          else if (uVar15 < 0xf800000) {
            uVar10 = (uVar10 | uVar15) + 0x38000000;
          }
          else {
            uVar10 = uVar10 | uVar15 | 0x7f800000;
          }
          *(uint *)(puVar12 + lVar8 + 8) = uVar10;
          psVar14 = psVar14 + 1;
          lVar8 = lVar8 + 0xc;
        } while ((ulong)uVar1 * 0xc != lVar8);
      }
      psVar13 = psVar13 + lVar11 * 3;
      puVar12 = puVar12 + iVar2;
      iVar7 = iVar7 + 1;
    } while (iVar7 < iVar5);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_half_to_float_3chan_interleave_rev (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2;
    uint8_t*        out0;
    int             w, h;
    int             linc0;

    w     = decode->channels[0].width;
    h     = decode->chunk.height - decode->user_line_end_ignore;
    linc0 = decode->channels[0].user_line_stride;

    out0 = decode->channels[2].decode_to_ptr;

    /*
     * not actually using y in the loop, so just pre-increment
     * the srcbuffer for any skip
     */
    srcbuffer += decode->user_line_begin_skip * w * 6;

    /* interleaving case, we can do this! */
    for (int y = decode->user_line_begin_skip; y < h; ++y)
    {
        float* out = (float*) out0;

        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;

        srcbuffer += w * 6; // 3 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
        {
            out[0] = half_to_float (one_to_native16 (in2[x]));
            out[1] = half_to_float (one_to_native16 (in1[x]));
            out[2] = half_to_float (one_to_native16 (in0[x]));
            out += 3;
        }
        out0 += linc0;
    }
    return EXR_ERR_SUCCESS;
}